

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvalMapString.h
# Opt level: O2

void __thiscall
Js::EvalMapStringInternal<true>::EvalMapStringInternal
          (EvalMapStringInternal<true> *this,FinalizableObject *obj,char16 *content,int charLength,
          ModuleID moduleID,BOOL strict,BOOL isLibraryCode)

{
  hash_t hVar1;
  
  this->owningVar = obj;
  Memory::WriteBarrierPtr<const_char16_t>::WriteBarrierSet(&(this->str).string,content);
  (this->str).len = charLength;
  this->moduleID = moduleID;
  this->strict = strict;
  this->isLibraryCode = isLibraryCode;
  hVar1 = JsUtil::CharacterBuffer<char16_t>::FastHash(&this->str);
  this->hash = hVar1 * 2 + 1;
  return;
}

Assistant:

EvalMapStringInternal(FinalizableObject* obj, __in_ecount(charLength) char16 const* content, int charLength, ModuleID moduleID, BOOL strict, BOOL isLibraryCode)
            : owningVar(obj), str(content, charLength), moduleID(moduleID), strict(strict), isLibraryCode(isLibraryCode)
        {
            // NOTE: this hash is not equivalent to the character buffer hash
            // Don't use a CharacteBuffer to do a map lookup on the EvalMapString.
            if (fastHash)
            {
                hash = TAGHASH(str.FastHash());
            }
            else
            {
                hash = TAGHASH((hash_t)str);
            }
        }